

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_pair(runtime_type *this,var *a,var *b)

{
  bool bVar1;
  type_info *ptVar2;
  runtime_error *this_00;
  any *in_RCX;
  any local_50;
  any local_48;
  any local_40;
  string local_38;
  
  ptVar2 = cs_impl::any::type(b);
  bVar1 = std::type_info::operator!=
                    (ptVar2,(type_info *)&std::pair<cs_impl::any,cs_impl::any>::typeinfo);
  if (bVar1) {
    ptVar2 = cs_impl::any::type(in_RCX);
    bVar1 = std::type_info::operator!=
                      (ptVar2,(type_info *)&std::pair<cs_impl::any,cs_impl::any>::typeinfo);
    if (bVar1) {
      local_40.mDat = b->mDat;
      if (local_40.mDat != (proxy *)0x0) {
        (local_40.mDat)->refcount = (local_40.mDat)->refcount + 1;
      }
      copy((EVP_PKEY_CTX *)&local_38,(EVP_PKEY_CTX *)&local_40);
      local_48.mDat = in_RCX->mDat;
      if (local_48.mDat != (proxy *)0x0) {
        (local_48.mDat)->refcount = (local_48.mDat)->refcount + 1;
      }
      copy((EVP_PKEY_CTX *)&local_50,(EVP_PKEY_CTX *)&local_48);
      cs_impl::any::make<std::pair<cs_impl::any,cs_impl::any>,cs_impl::any,cs_impl::any>
                ((any *)this,(any *)&local_38,&local_50);
      cs_impl::any::recycle(&local_50);
      cs_impl::any::recycle(&local_48);
      cs_impl::any::recycle((any *)&local_38);
      cs_impl::any::recycle(&local_40);
      return (var)(proxy *)this;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,"Unsupported operator operations(Pair).",(allocator *)&local_50);
  runtime_error::runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_pair(const var &a, const var &b)
	{
		if (a.type() != typeid(pair) && b.type() != typeid(pair))
			return var::make<pair>(copy(a), copy(b));
		else
			throw runtime_error("Unsupported operator operations(Pair).");
	}